

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall crnd::crn_unpacker::decode_alpha_selectors(crn_unpacker *this)

{
  symbol_codec *this_00;
  crn_header *pcVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  uint32 i;
  uint32 uVar4;
  uint8 *puVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint32 s1_linear;
  uint32 j;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32 s0_linear;
  uint uVar12;
  uint uVar13;
  static_huffman_data_model dm;
  uint8 dxt5_from_linear [64];
  static_huffman_data_model local_a0;
  byte abStack_78 [72];
  
  this_00 = &this->m_codec;
  pcVar1 = this->m_pHeader;
  uVar8 = (uint)(pcVar1->m_alpha_selectors).m_size.m_buf[2] |
          (uint)(pcVar1->m_alpha_selectors).m_size.m_buf[1] << 8 |
          (uint)(pcVar1->m_alpha_selectors).m_size.m_buf[0] << 0x10;
  if (uVar8 != 0) {
    puVar5 = this->m_pData +
             ((ulong)(pcVar1->m_alpha_selectors).m_ofs.m_buf[2] |
             (ulong)((uint)(pcVar1->m_alpha_selectors).m_ofs.m_buf[0] << 0x10 |
                    (uint)(pcVar1->m_alpha_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar5;
    (this->m_codec).m_pDecode_buf_next = puVar5;
    (this->m_codec).m_decode_buf_size = uVar8;
    (this->m_codec).m_pDecode_buf_end = puVar5 + uVar8;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  local_a0.m_total_syms = 0;
  local_a0.m_code_sizes.m_p = (uchar *)0x0;
  local_a0.m_code_sizes.m_size = 0;
  local_a0.m_code_sizes.m_capacity = 0;
  local_a0.m_code_sizes.m_alloc_failed = false;
  local_a0.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(this_00,&local_a0);
  uVar3 = *(ushort *)(this->m_pHeader->m_alpha_selectors).m_num.m_buf;
  uVar3 = uVar3 << 8 | uVar3 >> 8;
  vector<unsigned_short>::resize(&this->m_alpha_selectors,(uint)uVar3 + (uint)uVar3 * 2);
  for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
    abStack_78[uVar6] =
         *(char *)((long)&g_dxt5_from_linear + (uVar6 >> 3 & 0x1fffffff)) << 3 |
         *(byte *)((long)&g_dxt5_from_linear + (ulong)((uint)uVar6 & 7));
  }
  uVar12 = 0;
  uVar8 = 0;
  uVar6 = 0;
  while (uVar10 = (uint)uVar6, uVar10 < (this->m_alpha_selectors).m_size) {
    uVar13 = 0;
    for (uVar9 = 0; uVar9 < 0x18; uVar9 = uVar9 + 6) {
      uVar4 = symbol_codec::decode(this_00,&local_a0);
      bVar7 = (byte)uVar9;
      uVar12 = uVar12 ^ uVar4 << (bVar7 & 0x1f);
      uVar13 = uVar13 | (uint)abStack_78[uVar12 >> (bVar7 & 0x1f) & 0x3f] << (bVar7 & 0x1f);
    }
    uVar11 = 0;
    for (uVar9 = 0; uVar9 < 0x18; uVar9 = uVar9 + 6) {
      uVar4 = symbol_codec::decode(this_00,&local_a0);
      bVar7 = (byte)uVar9;
      uVar8 = uVar8 ^ uVar4 << (bVar7 & 0x1f);
      uVar11 = uVar11 | (uint)abStack_78[uVar8 >> (bVar7 & 0x1f) & 0x3f] << (bVar7 & 0x1f);
    }
    puVar2 = (this->m_alpha_selectors).m_p;
    puVar2[uVar6] = (unsigned_short)uVar13;
    puVar2[uVar6 + 1] = (ushort)(uVar11 << 8) | (ushort)(uVar13 >> 0x10);
    puVar2[uVar10 + 2] = (unsigned_short)(uVar11 >> 8);
    uVar6 = (ulong)(uVar10 + 3);
  }
  static_huffman_data_model::~static_huffman_data_model(&local_a0);
  return true;
}

Assistant:

bool decode_alpha_selectors()
        {
            m_codec.start_decoding(m_pData + m_pHeader->m_alpha_selectors.m_ofs, m_pHeader->m_alpha_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_alpha_selectors.resize(m_pHeader->m_alpha_selectors.m_num * 3);
            uint8 dxt5_from_linear[64];
            for (uint32 i = 0; i < 64; i++)
                dxt5_from_linear[i] = g_dxt5_from_linear[i & 7] | g_dxt5_from_linear[i >> 3] << 3;
            for (uint32 s0_linear = 0, s1_linear = 0, i = 0; i < m_alpha_selectors.size();)
            {
                uint32 s0 = 0, s1 = 0;
                for (uint32 j = 0; j < 24; s0 |= dxt5_from_linear[s0_linear >> j & 0x3F] << j, j += 6)
                    s0_linear ^= m_codec.decode(dm) << j;
                for (uint32 j = 0; j < 24; s1 |= dxt5_from_linear[s1_linear >> j & 0x3F] << j, j += 6)
                    s1_linear ^= m_codec.decode(dm) << j;
                m_alpha_selectors[i++] = s0;
                m_alpha_selectors[i++] = s0 >> 16 | s1 << 8;
                m_alpha_selectors[i++] = s1 >> 8;
            }
            m_codec.stop_decoding();
            return true;
        }